

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_find.hpp
# Opt level: O2

void __thiscall openjij::utility::UnionFind::UnionFind(UnionFind *this,size_type n)

{
  pointer puVar1;
  pointer puVar2;
  long lVar3;
  unsigned_long uVar4;
  allocator_type local_1a;
  allocator_type local_19;
  value_type_conflict1 local_18;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->_parent,n,&local_19);
  local_18 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->_rank,n,&local_18,&local_1a);
  puVar1 = (this->_parent).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_start;
  puVar2 = (this->_parent).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_finish;
  uVar4 = 0;
  for (lVar3 = 0; (pointer)((long)puVar1 + lVar3) != puVar2; lVar3 = lVar3 + 8) {
    puVar1[uVar4] = uVar4;
    uVar4 = uVar4 + 1;
  }
  return;
}

Assistant:

explicit UnionFind(size_type n) : _parent(n), _rank(n, 0) {
    std::iota(_parent.begin(), _parent.end(), 0);
  }